

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void __thiscall cmExtraEclipseCDT4Generator::CreateProjectFile(cmExtraEclipseCDT4Generator *this)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  pointer pcVar3;
  cmMakefile *this_00;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  _Base_ptr p_Var8;
  cmState *this_01;
  size_t sVar9;
  long lVar10;
  cmExtraEclipseCDT4Generator *this_02;
  cmLocalGenerator *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *content;
  char *__end;
  string sourceLinkedResourceName;
  cmXMLWriter xml;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraNatures;
  string compilerId;
  string filename;
  ostringstream environment;
  ostringstream errorOutputParser;
  cmGeneratedFileStream fout;
  string local_6a0;
  allocator local_679;
  cmXMLWriter local_678;
  string local_628;
  undefined1 local_608 [32];
  cmLocalGenerator *local_5e8;
  string *local_5e0;
  cmExtraEclipseCDT4Generator *local_5d8;
  cmMakefile *local_5d0;
  long *local_5c8;
  char *local_5c0;
  long local_5b8 [2];
  long *local_5a8 [2];
  long local_598 [2];
  undefined1 local_588 [112];
  ios_base local_518 [264];
  string local_410;
  undefined1 local_3f0 [112];
  ios_base local_380 [264];
  undefined1 local_278 [584];
  
  pcVar11 = *(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_5d0 = pcVar11->Makefile;
  local_5a8[0] = local_598;
  pcVar2 = (this->HomeOutputDirectory)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5a8,pcVar2,pcVar2 + (this->HomeOutputDirectory)._M_string_length);
  std::__cxx11::string::append((char *)local_5a8);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(char *)local_5a8[0],false,None);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) != 0)
  goto LAB_003a5f65;
  pcVar2 = local_588 + 0x10;
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"CMAKE_C_COMPILER_ID","");
  this_00 = local_5d0;
  pcVar6 = cmMakefile::GetSafeDefinition(local_5d0,(string *)local_588);
  std::__cxx11::string::string((string *)&local_5c8,pcVar6,(allocator *)local_3f0);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_5e8 = pcVar11;
  if (local_5c0 == (char *)0x0) {
    local_588._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"CMAKE_CXX_COMPILER_ID","");
    pcVar6 = cmMakefile::GetSafeDefinition(this_00,(string *)local_588);
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&local_5c8,0,local_5c0,(ulong)pcVar6);
    pcVar11 = local_5e8;
    if ((pointer)local_588._0_8_ != pcVar2) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
  }
  cmXMLWriter::cmXMLWriter(&local_678,(ostream *)local_278,0);
  cmXMLWriter::StartDocument(&local_678,"UTF-8");
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"projectDescription","");
  cmXMLWriter::StartElement(&local_678,(string *)local_588);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"name","");
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_6a0,pcVar11);
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"CMAKE_BUILD_TYPE","");
  pcVar6 = cmMakefile::GetSafeDefinition(this_00,&local_628);
  std::__cxx11::string::string((string *)local_608,pcVar6,&local_679);
  local_5e0 = &this->HomeOutputDirectory;
  GetPathBasename(&local_410,local_5e0);
  GenerateProjectName((string *)local_3f0,&local_6a0,(string *)local_608,&local_410);
  cmXMLWriter::StartElement(&local_678,(string *)local_588);
  cmXMLWriter::Content<std::__cxx11::string>
            (&local_678,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0);
  cmXMLWriter::EndElement(&local_678);
  pcVar6 = local_3f0 + 0x10;
  if ((char *)local_3f0._0_8_ != pcVar6) {
    operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_608 + 0x10)) {
    operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"comment","");
  cmXMLWriter::StartElement(&local_678,(string *)local_588);
  cmXMLWriter::Content<char[1]>(&local_678,(char (*) [1])0x59946e);
  cmXMLWriter::EndElement(&local_678);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"projects","");
  cmXMLWriter::StartElement(&local_678,(string *)local_588);
  cmXMLWriter::Content<char[1]>(&local_678,(char (*) [1])0x59946e);
  cmXMLWriter::EndElement(&local_678);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"buildSpec","");
  cmXMLWriter::StartElement(&local_678,(string *)local_588);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"buildCommand","");
  cmXMLWriter::StartElement(&local_678,(string *)local_588);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"name","");
  cmXMLWriter::StartElement(&local_678,(string *)local_588);
  cmXMLWriter::Content<char[38]>(&local_678,(char (*) [38])"org.eclipse.cdt.make.core.makeBuilder");
  cmXMLWriter::EndElement(&local_678);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"triggers","");
  cmXMLWriter::StartElement(&local_678,(string *)local_588);
  cmXMLWriter::Content<char[24]>(&local_678,(char (*) [24])"clean,full,incremental,");
  cmXMLWriter::EndElement(&local_678);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"arguments","");
  cmXMLWriter::StartElement(&local_678,(string *)local_588);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  AppendDictionary<char[6]>
            (&local_678,"org.eclipse.cdt.make.core.cleanBuildTarget",(char (*) [6])0x586499);
  AppendDictionary<char[5]>
            (&local_678,"org.eclipse.cdt.make.core.enableCleanBuild",(char (*) [5])0x57b6f3);
  AppendDictionary<char[5]>
            (&local_678,"org.eclipse.cdt.make.core.append_environment",(char (*) [5])0x57b6f3);
  AppendDictionary<char[5]>
            (&local_678,"org.eclipse.cdt.make.core.stopOnError",(char (*) [5])0x57b6f3);
  AppendDictionary<char[5]>
            (&local_678,"org.eclipse.cdt.make.core.enabledIncrementalBuild",(char (*) [5])0x57b6f3);
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"CMAKE_MAKE_PROGRAM","");
  pcVar7 = cmMakefile::GetRequiredDefinition(this_00,&local_6a0);
  std::__cxx11::string::string((string *)local_3f0,pcVar7,(allocator *)local_608);
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_588,local_3f0._0_8_,(char *)(local_3f0._0_8_ + local_3f0._8_8_));
  AppendDictionary<std::__cxx11::string>
            (&local_678,"org.eclipse.cdt.make.core.build.command",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  if ((char *)local_3f0._0_8_ != pcVar6) {
    operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  AppendDictionary<char[47]>
            (&local_678,"org.eclipse.cdt.make.core.contents",
             (char (*) [47])"org.eclipse.cdt.make.core.activeConfigSettings");
  AppendDictionary<char[4]>
            (&local_678,"org.eclipse.cdt.make.core.build.target.inc",(char (*) [4])0x57a469);
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_588,"CMAKE_ECLIPSE_MAKE_ARGUMENTS","");
  local_3f0._0_8_ = cmMakefile::GetSafeDefinition(this_00,(string *)local_588);
  AppendDictionary<char_const*>
            (&local_678,"org.eclipse.cdt.make.core.build.arguments",(char **)local_3f0);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  pcVar3 = (this->HomeOutputDirectory)._M_dataplus._M_p;
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_588,pcVar3,pcVar3 + (this->HomeOutputDirectory)._M_string_length);
  AppendDictionary<std::__cxx11::string>
            (&local_678,"org.eclipse.cdt.make.core.buildLocation",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  AppendDictionary<char[6]>
            (&local_678,"org.eclipse.cdt.make.core.useDefaultBuildCmd",(char (*) [6])0x58ebc2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_588);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_588,"VERBOSE=1|CMAKE_NO_VERBOSE=1|",0x1d);
  iVar5 = std::__cxx11::string::compare((char *)&local_5c8);
  if (iVar5 == 0) {
    AddEnvVar((ostream *)local_588,"PATH",pcVar11);
    AddEnvVar((ostream *)local_588,"INCLUDE",pcVar11);
    AddEnvVar((ostream *)local_588,"LIB",pcVar11);
    pcVar7 = "LIBPATH";
LAB_003a5646:
    AddEnvVar((ostream *)local_588,pcVar7,pcVar11);
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_5c8);
    if (iVar5 == 0) {
      pcVar7 = "INTEL_LICENSE_FILE";
      goto LAB_003a5646;
    }
  }
  std::__cxx11::stringbuf::str();
  AppendDictionary<std::__cxx11::string>
            (&local_678,"org.eclipse.cdt.make.core.environment",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0);
  if ((char *)local_3f0._0_8_ != pcVar6) {
    operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
  }
  AppendDictionary<char[5]>
            (&local_678,"org.eclipse.cdt.make.core.enableFullBuild",(char (*) [5])0x57b6f3);
  AppendDictionary<char[4]>
            (&local_678,"org.eclipse.cdt.make.core.build.target.auto",(char (*) [4])0x57a469);
  AppendDictionary<char[6]>
            (&local_678,"org.eclipse.cdt.make.core.enableAutoBuild",(char (*) [6])0x58ebc2);
  AppendDictionary<char[6]>
            (&local_678,"org.eclipse.cdt.make.core.build.target.clean",(char (*) [6])0x586499);
  AppendDictionary<char[4]>
            (&local_678,"org.eclipse.cdt.make.core.fullBuildTarget",(char (*) [4])0x57a469);
  AppendDictionary<char[1]>
            (&local_678,"org.eclipse.cdt.make.core.buildArguments",(char (*) [1])0x59946e);
  pcVar2 = (this->HomeOutputDirectory)._M_dataplus._M_p;
  local_3f0._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3f0,pcVar2,pcVar2 + (this->HomeOutputDirectory)._M_string_length);
  AppendDictionary<std::__cxx11::string>
            (&local_678,"org.eclipse.cdt.make.core.build.location",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0);
  if ((char *)local_3f0._0_8_ != pcVar6) {
    operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
  }
  AppendDictionary<char[4]>
            (&local_678,"org.eclipse.cdt.make.core.autoBuildTarget",(char (*) [4])0x57a469);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
  iVar5 = std::__cxx11::string::compare((char *)&local_5c8);
  if (iVar5 == 0) {
    lVar10 = 0x23;
    pcVar6 = "org.eclipse.cdt.core.VCErrorParser;";
LAB_003a57f7:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,pcVar6,lVar10);
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_5c8);
    if (iVar5 == 0) {
      lVar10 = 0x24;
      pcVar6 = "org.eclipse.cdt.core.ICCErrorParser;";
      goto LAB_003a57f7;
    }
  }
  pcVar6 = "org.eclipse.cdt.core.MakeErrorParser;";
  if ((ulong)this->SupportsGmakeErrorParser != 0) {
    pcVar6 = "org.eclipse.cdt.core.GmakeErrorParser;";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,pcVar6,(ulong)this->SupportsGmakeErrorParser + 0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,
             "org.eclipse.cdt.core.GCCErrorParser;org.eclipse.cdt.core.GASErrorParser;org.eclipse.cdt.core.GLDErrorParser;"
             ,0x6c);
  std::__cxx11::stringbuf::str();
  AppendDictionary<std::__cxx11::string>
            (&local_678,"org.eclipse.cdt.core.errorOutputParser",&local_6a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::EndElement(&local_678);
  cmXMLWriter::EndElement(&local_678);
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"buildCommand","");
  cmXMLWriter::StartElement(&local_678,&local_6a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"name","");
  cmXMLWriter::StartElement(&local_678,&local_6a0);
  cmXMLWriter::Content<char[47]>
            (&local_678,(char (*) [47])"org.eclipse.cdt.make.core.ScannerConfigBuilder");
  cmXMLWriter::EndElement(&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"arguments","");
  cmXMLWriter::StartElement(&local_678,&local_6a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::EndElement(&local_678);
  cmXMLWriter::EndElement(&local_678);
  cmXMLWriter::EndElement(&local_678);
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"natures","");
  cmXMLWriter::StartElement(&local_678,&local_6a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"nature","");
  cmXMLWriter::StartElement(&local_678,&local_6a0);
  cmXMLWriter::Content<char[37]>(&local_678,(char (*) [37])"org.eclipse.cdt.make.core.makeNature");
  cmXMLWriter::EndElement(&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"nature","");
  cmXMLWriter::StartElement(&local_678,&local_6a0);
  cmXMLWriter::Content<char[46]>
            (&local_678,(char (*) [46])"org.eclipse.cdt.make.core.ScannerConfigNature");
  cmXMLWriter::EndElement(&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  p_Var8 = (this->Natures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->Natures)._M_t._M_impl.super__Rb_tree_header;
  local_5d8 = this;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    do {
      local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"nature","");
      cmXMLWriter::StartElement(&local_678,&local_6a0);
      cmXMLWriter::Content<std::__cxx11::string>
                (&local_678,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var8 + 1));
      cmXMLWriter::EndElement(&local_678);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
        operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  }
  this_01 = cmMakefile::GetState(local_5d0);
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"ECLIPSE_EXTRA_NATURES","");
  pcVar11 = local_5e8;
  pcVar6 = cmState::GetGlobalProperty(this_01,&local_6a0);
  this_02 = local_5d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  if (pcVar6 != (char *)0x0) {
    local_608._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_608._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_608._16_8_ = 0;
    local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
    sVar9 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,pcVar6,pcVar6 + sVar9);
    cmSystemTools::ExpandListArgument
              (&local_6a0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_608,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
      operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
    }
    if (local_608._0_8_ != local_608._8_8_) {
      content = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608._0_8_
      ;
      do {
        local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"nature","");
        cmXMLWriter::StartElement(&local_678,&local_6a0);
        cmXMLWriter::Content<std::__cxx11::string>(&local_678,content);
        cmXMLWriter::EndElement(&local_678);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
          operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
        }
        content = content + 1;
      } while (content !=
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608._8_8_)
      ;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_608);
    this_02 = local_5d8;
    pcVar11 = local_5e8;
  }
  cmXMLWriter::EndElement(&local_678);
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"linkedResources","");
  cmXMLWriter::StartElement(&local_678,&local_6a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  if (this_02->IsOutOfSourceBuild == true) {
    local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"[Source directory]","");
    pcVar6 = cmLocalGenerator::GetCurrentSourceDirectory(pcVar11);
    std::__cxx11::string::string((string *)&local_628,pcVar6,(allocator *)&local_410);
    local_608._0_8_ = local_608 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_608,local_628._M_dataplus._M_p,
               local_628._M_dataplus._M_p + local_628._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_dataplus._M_p != &local_628.field_2) {
      operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
    }
    bVar4 = cmsys::SystemTools::IsSubDirectory(local_5e0,(string *)local_608);
    if (!bVar4) {
      local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_628,local_608._0_8_,
                 (pointer)(local_608._0_8_ + (long)(_Alloc_hider *)local_608._8_8_));
      AppendLinkedResource(&local_678,&local_6a0,&local_628,LinkToFolder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this_02->SrcLinkedResources,&local_6a0);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_608 + 0x10)) {
      operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
      operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
    }
  }
  if (this_02->SupportsVirtualFolders == true) {
    CreateLinksToSubprojects(this_02,&local_678,local_5e0);
    CreateLinksForTargets(this_02,&local_678);
  }
  cmXMLWriter::EndElement(&local_678);
  cmXMLWriter::EndElement(&local_678);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
  std::ios_base::~ios_base(local_380);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_588);
  std::ios_base::~ios_base(local_518);
  cmXMLWriter::~cmXMLWriter(&local_678);
  if (local_5c8 != local_5b8) {
    operator_delete(local_5c8,local_5b8[0] + 1);
  }
LAB_003a5f65:
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  if (local_5a8[0] != local_598) {
    operator_delete(local_5a8[0],local_598[0] + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateProjectFile()
{
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  cmMakefile* mf = lg->GetMakefile();

  const std::string filename = this->HomeOutputDirectory + "/.project";

  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return;
  }

  std::string compilerId = mf->GetSafeDefinition("CMAKE_C_COMPILER_ID");
  if (compilerId.empty()) // no C compiler, try the C++ compiler:
  {
    compilerId = mf->GetSafeDefinition("CMAKE_CXX_COMPILER_ID");
  }

  cmXMLWriter xml(fout);

  xml.StartDocument("UTF-8");
  xml.StartElement("projectDescription");

  xml.Element("name", this->GenerateProjectName(
                        lg->GetProjectName(),
                        mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
                        this->GetPathBasename(this->HomeOutputDirectory)));

  xml.Element("comment", "");
  xml.Element("projects", "");

  xml.StartElement("buildSpec");
  xml.StartElement("buildCommand");
  xml.Element("name", "org.eclipse.cdt.make.core.makeBuilder");
  xml.Element("triggers", "clean,full,incremental,");
  xml.StartElement("arguments");

  // use clean target
  AppendDictionary(xml, "org.eclipse.cdt.make.core.cleanBuildTarget", "clean");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableCleanBuild", "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.append_environment",
                   "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.stopOnError", "true");

  // set the make command
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enabledIncrementalBuild",
                   "true");
  AppendDictionary(
    xml, "org.eclipse.cdt.make.core.build.command",
    this->GetEclipsePath(mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM")));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.contents",
                   "org.eclipse.cdt.make.core.activeConfigSettings");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.inc", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.arguments",
                   mf->GetSafeDefinition("CMAKE_ECLIPSE_MAKE_ARGUMENTS"));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.buildLocation",
                   this->GetEclipsePath(this->HomeOutputDirectory));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.useDefaultBuildCmd",
                   "false");

  // set project specific environment
  std::ostringstream environment;
  environment << "VERBOSE=1|CMAKE_NO_VERBOSE=1|"; // verbose Makefile output
  // set vsvars32.bat environment available at CMake time,
  //   but not necessarily when eclipse is open
  if (compilerId == "MSVC") {
    AddEnvVar(environment, "PATH", lg);
    AddEnvVar(environment, "INCLUDE", lg);
    AddEnvVar(environment, "LIB", lg);
    AddEnvVar(environment, "LIBPATH", lg);
  } else if (compilerId == "Intel") {
    // if the env.var is set, use this one and put it in the cache
    // if the env.var is not set, but the value is in the cache,
    // use it from the cache:
    AddEnvVar(environment, "INTEL_LICENSE_FILE", lg);
  }
  AppendDictionary(xml, "org.eclipse.cdt.make.core.environment",
                   environment.str());

  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableFullBuild", "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.auto", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableAutoBuild", "false");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.clean",
                   "clean");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.fullBuildTarget", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.buildArguments", "");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.location",
                   this->GetEclipsePath(this->HomeOutputDirectory));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.autoBuildTarget", "all");

  // set error parsers
  std::ostringstream errorOutputParser;

  if (compilerId == "MSVC") {
    errorOutputParser << "org.eclipse.cdt.core.VCErrorParser;";
  } else if (compilerId == "Intel") {
    errorOutputParser << "org.eclipse.cdt.core.ICCErrorParser;";
  }

  if (this->SupportsGmakeErrorParser) {
    errorOutputParser << "org.eclipse.cdt.core.GmakeErrorParser;";
  } else {
    errorOutputParser << "org.eclipse.cdt.core.MakeErrorParser;";
  }

  errorOutputParser << "org.eclipse.cdt.core.GCCErrorParser;"
                       "org.eclipse.cdt.core.GASErrorParser;"
                       "org.eclipse.cdt.core.GLDErrorParser;";
  AppendDictionary(xml, "org.eclipse.cdt.core.errorOutputParser",
                   errorOutputParser.str());

  xml.EndElement(); // arguments
  xml.EndElement(); // buildCommand
  xml.StartElement("buildCommand");
  xml.Element("name", "org.eclipse.cdt.make.core.ScannerConfigBuilder");
  xml.StartElement("arguments");
  xml.EndElement(); // arguments
  xml.EndElement(); // buildCommand
  xml.EndElement(); // buildSpec

  // set natures for c/c++ projects
  xml.StartElement("natures");
  xml.Element("nature", "org.eclipse.cdt.make.core.makeNature");
  xml.Element("nature", "org.eclipse.cdt.make.core.ScannerConfigNature");
  ;

  for (std::set<std::string>::const_iterator nit = this->Natures.begin();
       nit != this->Natures.end(); ++nit) {
    xml.Element("nature", *nit);
  }

  if (const char* extraNaturesProp =
        mf->GetState()->GetGlobalProperty("ECLIPSE_EXTRA_NATURES")) {
    std::vector<std::string> extraNatures;
    cmSystemTools::ExpandListArgument(extraNaturesProp, extraNatures);
    for (std::vector<std::string>::const_iterator nit = extraNatures.begin();
         nit != extraNatures.end(); ++nit) {
      xml.Element("nature", *nit);
    }
  }

  xml.EndElement(); // natures

  xml.StartElement("linkedResources");
  // create linked resources
  if (this->IsOutOfSourceBuild) {
    // create a linked resource to CMAKE_SOURCE_DIR
    // (this is not done anymore for each project because of
    // https://gitlab.kitware.com/cmake/cmake/issues/9978 and because I found
    // it actually quite confusing in bigger projects with many directories and
    // projects, Alex

    std::string sourceLinkedResourceName = "[Source directory]";
    std::string linkSourceDirectory =
      this->GetEclipsePath(lg->GetCurrentSourceDirectory());
    // .project dir can't be subdir of a linked resource dir
    if (!cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                       linkSourceDirectory)) {
      this->AppendLinkedResource(xml, sourceLinkedResourceName,
                                 this->GetEclipsePath(linkSourceDirectory),
                                 LinkToFolder);
      this->SrcLinkedResources.push_back(sourceLinkedResourceName);
    }
  }

  if (this->SupportsVirtualFolders) {
    this->CreateLinksToSubprojects(xml, this->HomeOutputDirectory);

    this->CreateLinksForTargets(xml);
  }

  xml.EndElement(); // linkedResources
  xml.EndElement(); // projectDescription
}